

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool PairSearchHelperBool
               (ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBool *a_result)

{
  int iVar1;
  bool bVar2;
  ON_RTreeBranch *pOVar3;
  ON_RTreeBranch *branchBmax;
  ON_RTreeBranch *branchB;
  ON_RTreeBranch *branchAmax;
  ON_RTreeBranch *branchA;
  ON_RTreePairSearchCallbackResultBool *a_result_local;
  ON_RTreeNode *a_nodeB_local;
  ON_RTreeNode *a_nodeA_local;
  
  branchAmax = a_nodeA->m_branch;
  pOVar3 = branchAmax + a_nodeA->m_count;
  iVar1 = a_nodeB->m_count;
  do {
    if (pOVar3 <= branchAmax) {
      return true;
    }
    for (branchBmax = a_nodeB->m_branch; branchBmax < a_nodeB->m_branch + iVar1;
        branchBmax = branchBmax + 1) {
      bVar2 = PairSearchOverlapHelper(&branchAmax->m_rect,&branchBmax->m_rect,a_result->m_tolerance)
      ;
      if (bVar2) {
        if (a_nodeA->m_level < 1) {
          if (a_nodeB->m_level < 1) {
            bVar2 = (*a_result->m_resultCallbackBool)
                              (a_result->m_context,(ON__INT_PTR)(branchAmax->field_1).m_child,
                               (ON__INT_PTR)(branchBmax->field_1).m_child);
            if (!bVar2) {
              return false;
            }
          }
          else {
            bVar2 = PairSearchHelperBool(branchAmax,(branchBmax->field_1).m_child,a_result);
            if (!bVar2) {
              return false;
            }
          }
        }
        else if (a_nodeB->m_level < 1) {
          bVar2 = PairSearchHelperBool((branchAmax->field_1).m_child,branchBmax,a_result);
          if (!bVar2) {
            return false;
          }
        }
        else {
          bVar2 = PairSearchHelperBool
                            ((branchAmax->field_1).m_child,(branchBmax->field_1).m_child,a_result);
          if (!bVar2) {
            return false;
          }
        }
      }
    }
    branchAmax = branchAmax + 1;
  } while( true );
}

Assistant:

static bool PairSearchHelperBool( const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBool* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;
  while(branchA < branchAmax)
  {
    for ( branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++ )
    {
      if ( PairSearchOverlapHelper( &branchA->m_rect, &branchB->m_rect, a_result->m_tolerance ) )
      {
        if ( a_nodeA->m_level > 0 )
        {
          if ( a_nodeB->m_level > 0 )
          {
            if ( !PairSearchHelperBool(branchA->m_child,branchB->m_child,a_result) )
              return false;
          }
          else
          {
            if ( !PairSearchHelperBool(branchA->m_child,branchB,a_result) )
              return false;
          }
        }
        else if ( a_nodeB->m_level > 0 )
        {
          if ( !PairSearchHelperBool(branchA,branchB->m_child,a_result) )
            return false;
        }
        else
        {
          if ( !a_result->m_resultCallbackBool(a_result->m_context,branchA->m_id,branchB->m_id) )
            return false;
        }
      }
    }
    branchA++;
  }
  return true;
}